

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int checkTreePage(IntegrityCk *pCheck,int iPage,i64 *pnParentMinKey,i64 *pnParentMaxKey)

{
  char *pcVar1;
  u8 uVar2;
  byte bVar3;
  undefined1 uVar4;
  BtShared *pBt;
  long *plVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  i64 iVar9;
  ushort uVar10;
  u16 uVar11;
  int iVar12;
  uint uVar13;
  u32 uVar14;
  void *__s;
  ulong uVar15;
  undefined1 *puVar16;
  uint uVar17;
  i64 *piVar18;
  undefined1 *puVar19;
  ulong uVar20;
  char *pcVar21;
  u8 *pCell;
  ushort uVar22;
  i64 local_b8;
  int local_ac;
  long *local_a8;
  uint local_9c;
  long *local_98;
  i64 nMinKey;
  long local_88;
  ulong local_80;
  char *local_78;
  MemPage *pPage;
  CellInfo info;
  
  nMinKey = 0;
  local_b8 = 0;
  if (iPage == 0) {
    return 0;
  }
  pBt = pCheck->pBt;
  pcVar21 = pCheck->zPfx;
  iVar6 = pCheck->v1;
  iVar7 = pCheck->v2;
  uVar17 = pBt->usableSize;
  local_a8 = pnParentMaxKey;
  local_98 = pnParentMinKey;
  iVar12 = checkRef(pCheck,iPage);
  if (iVar12 != 0) {
    return 0;
  }
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  iVar12 = 0;
  uVar13 = btreeGetPage(pBt,iPage,&pPage,0);
  if (uVar13 != 0) {
    checkAppendMsg(pCheck,"unable to get the page. error code=%d",(ulong)uVar13);
    goto LAB_00136543;
  }
  pPage->isInit = '\0';
  uVar13 = btreeInitPage(pPage);
  if (uVar13 != 0) {
    iVar12 = 0;
    checkAppendMsg(pCheck,"btreeInitPage() returns error code %d",(ulong)uVar13);
    releasePage(pPage);
    goto LAB_00136543;
  }
  local_88 = CONCAT44(local_88._4_4_,uVar17 - 5);
  local_9c = uVar17 - 4;
  uVar20 = 0;
  iVar12 = 0;
  local_80 = (ulong)uVar17;
  local_78 = pcVar21;
  while ((uVar22 = pPage->nCell, local_ac = iVar12, uVar20 < uVar22 && (pCheck->mxErr != 0))) {
    pCheck->zPfx = "On tree page %d cell %d: ";
    pCheck->v1 = iPage;
    pCheck->v2 = (int)uVar20;
    pCell = pPage->aData +
            (CONCAT11(pPage->aCellIdx[uVar20 * 2],pPage->aCellIdx[uVar20 * 2 + 1]) & pPage->maskPage
            );
    btreeParseCellPtr(pPage,pCell,&info);
    uVar14 = info.nPayload;
    iVar9 = info.nKey;
    if (pPage->intKey != '\0') {
      if (uVar20 == 0) {
        nMinKey = info.nKey;
      }
      else if (info.nKey <= local_b8) {
        checkAppendMsg(pCheck,"Rowid %lld out of order (previous was %lld)",info.nKey);
      }
      local_b8 = iVar9;
    }
    if ((info.nLocal < uVar14) && (pCell + info.iOverflow <= pPage->aData + pBt->usableSize)) {
      uVar17 = ((uVar14 + (int)local_88) - (uint)info.nLocal) / local_9c;
      uVar14 = sqlite3Get4byte(pCell + info.iOverflow);
      if (pBt->autoVacuum != '\0') {
        checkPtrmap(pCheck,uVar14,'\x03',iPage);
      }
      checkList(pCheck,0,uVar14,uVar17);
    }
    iVar12 = local_ac;
    if (pPage->leaf == '\0') {
      uVar14 = sqlite3Get4byte(pCell);
      if (pBt->autoVacuum != '\0') {
        checkPtrmap(pCheck,uVar14,'\x05',iPage);
      }
      piVar18 = &local_b8;
      if (uVar20 == 0) {
        piVar18 = (i64 *)0x0;
      }
      iVar12 = checkTreePage(pCheck,uVar14,&nMinKey,piVar18);
      if ((uVar20 != 0) && (iVar12 != local_ac)) {
        checkAppendMsg(pCheck,"Child page depth differs");
      }
    }
    uVar20 = uVar20 + 1;
  }
  if (pPage->leaf == '\0') {
    uVar14 = sqlite3Get4byte(pPage->aData + (ulong)pPage->hdrOffset + 8);
    pCheck->zPfx = "On page %d at right child: ";
    pCheck->v1 = iPage;
    if (pBt->autoVacuum != '\0') {
      checkPtrmap(pCheck,uVar14,'\x05',iPage);
      uVar22 = pPage->nCell;
    }
    piVar18 = &local_b8;
    if (uVar22 == 0) {
      piVar18 = (i64 *)0x0;
    }
    checkTreePage(pCheck,uVar14,(i64 *)0x0,piVar18);
    uVar2 = pPage->leaf;
    pCheck->zPfx = "Page %d: ";
    pCheck->v1 = iPage;
    if (uVar2 != '\0') goto LAB_00136288;
  }
  else {
    pCheck->zPfx = "Page %d: ";
    pCheck->v1 = iPage;
LAB_00136288:
    plVar5 = local_98;
    if (pPage->intKey != '\0') {
      if (local_98 == (long *)0x0) {
        if ((local_a8 != (long *)0x0) && (nMinKey <= *local_a8)) {
          pcVar21 = "Rowid %lld out of order (min less than parent max of %lld)";
LAB_0013632b:
          checkAppendMsg(pCheck,pcVar21);
        }
      }
      else if (local_a8 == (long *)0x0) {
        if (*local_98 < local_b8) {
          pcVar21 = "Rowid %lld out of order (max larger than parent min of %lld)";
          goto LAB_0013632b;
        }
      }
      else {
        if (nMinKey <= *local_98) {
          checkAppendMsg(pCheck,"Rowid %lld out of order (min less than parent min of %lld)");
        }
        if (*local_a8 < local_b8) {
          checkAppendMsg(pCheck,"Rowid %lld out of order (max larger than parent max of %lld)");
        }
        *plVar5 = local_b8;
      }
    }
  }
  plVar5 = (long *)pPage->aData;
  bVar3 = pPage->hdrOffset;
  __s = pcache1Alloc(pBt->pageSize);
  pCheck->zPfx = (char *)0x0;
  if (__s == (void *)0x0) {
    pCheck->mallocFailed = 1;
    pcVar21 = local_78;
  }
  else {
    uVar20 = (ulong)bVar3;
    local_88 = uVar20 + (long)plVar5;
    uVar17 = ((uint)*(byte *)((long)plVar5 + uVar20 + 5) * 0x100 +
             (uint)*(byte *)((long)plVar5 + uVar20 + 6)) - 1 & 0xffff;
    memset((void *)((long)__s + (ulong)uVar17 + 1),0,(long)(int)(~uVar17 + (int)local_80));
    memset(__s,1,(ulong)uVar17 + 1);
    uVar22 = *(ushort *)((long)plVar5 + uVar20 + 3);
    local_a8 = (long *)((long)plVar5 + (ulong)bVar3 + (ulong)pPage->leaf * -4 + 0xc);
    local_98 = plVar5;
    for (uVar20 = 0; pcVar21 = local_78, lVar8 = local_88,
        uVar20 != (ushort)(uVar22 << 8 | uVar22 >> 8); uVar20 = uVar20 + 1) {
      uVar10 = *(ushort *)((long)local_a8 + uVar20 * 2);
      uVar10 = uVar10 << 8 | uVar10 >> 8;
      uVar17 = 0x10000;
      if (uVar10 == local_9c || (int)(uint)uVar10 < (int)local_9c) {
        uVar11 = cellSizePtr(pPage,(u8 *)((long)local_98 + (ulong)uVar10));
        uVar17 = (uint)uVar11;
      }
      uVar17 = uVar17 + uVar10;
      if ((int)local_80 < (int)uVar17) {
        pCheck->zPfx = (char *)0x0;
        checkAppendMsg(pCheck,"Corruption detected in cell %d on page %d",uVar20 & 0xffffffff,
                       (ulong)(uint)iPage);
      }
      else {
        for (uVar15 = (ulong)uVar17; (long)(ulong)uVar10 < (long)uVar15; uVar15 = uVar15 - 1) {
          pcVar21 = (char *)((long)__s + (uVar15 - 1));
          *pcVar21 = *pcVar21 + '\x01';
        }
      }
    }
    puVar16 = (undefined1 *)(local_88 + 1);
    puVar19 = (undefined1 *)(local_88 + 2);
    while( true ) {
      uVar4 = *puVar16;
      uVar20 = (ulong)CONCAT11(uVar4,*puVar19);
      if (uVar20 == 0) break;
      puVar16 = (undefined1 *)((long)local_98 + uVar20);
      for (uVar15 = (ulong)((uint)*(byte *)((long)local_98 + uVar20 + 3) +
                            (uint)CONCAT11(uVar4,*puVar19) +
                           (uint)*(byte *)((long)local_98 + uVar20 + 2) * 0x100);
          (long)uVar20 < (long)uVar15; uVar15 = uVar15 - 1) {
        pcVar1 = (char *)((long)__s + (uVar15 - 1));
        *pcVar1 = *pcVar1 + '\x01';
      }
      puVar19 = puVar16 + 1;
    }
    uVar15 = 0;
    uVar20 = local_80 & 0xffffffff;
    if ((int)local_80 < 1) {
      uVar20 = uVar15;
    }
    uVar17 = 0;
    for (; uVar20 != uVar15; uVar15 = uVar15 + 1) {
      if (*(char *)((long)__s + uVar15) == '\0') {
        uVar17 = uVar17 + 1;
      }
      else if ('\x01' < *(char *)((long)__s + uVar15)) {
        checkAppendMsg(pCheck,"Multiple uses for byte %d of page %d",uVar15,(ulong)(uint)iPage);
        break;
      }
    }
    if (uVar17 != *(byte *)(lVar8 + 7)) {
      checkAppendMsg(pCheck,"Fragmentation of %d bytes reported as %d on page %d",(ulong)uVar17,
                     (ulong)*(byte *)(lVar8 + 7),(ulong)(uint)iPage);
    }
  }
  pcache1Free(__s);
  releasePage(pPage);
  iVar12 = local_ac + 1;
LAB_00136543:
  pCheck->zPfx = pcVar21;
  pCheck->v1 = iVar6;
  pCheck->v2 = iVar7;
  return iVar12;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  int iPage,            /* Page number of the page to check */
  i64 *pnParentMinKey, 
  i64 *pnParentMaxKey
){
  MemPage *pPage;
  int i, rc, depth, d2, pgno, cnt;
  int hdr, cellStart;
  int nCell;
  u8 *data;
  BtShared *pBt;
  int usableSize;
  char *hit = 0;
  i64 nMinKey = 0;
  i64 nMaxKey = 0;
  const char *saved_zPfx = pCheck->zPfx;
  int saved_v1 = pCheck->v1;
  int saved_v2 = pCheck->v2;

  /* Check that the page exists
  */
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage) ) return 0;
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  if( (rc = btreeGetPage(pBt, (Pgno)iPage, &pPage, 0))!=0 ){
    checkAppendMsg(pCheck,
       "unable to get the page. error code=%d", rc);
    depth = -1;
    goto end_of_check;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck,
                   "btreeInitPage() returns error code %d", rc);
    releasePage(pPage);
    depth = -1;
    goto end_of_check;
  }

  /* Check out all the cells.
  */
  depth = 0;
  for(i=0; i<pPage->nCell && pCheck->mxErr; i++){
    u8 *pCell;
    u32 sz;
    CellInfo info;

    /* Check payload overflow pages
    */
    pCheck->zPfx = "On tree page %d cell %d: ";
    pCheck->v1 = iPage;
    pCheck->v2 = i;
    pCell = findCell(pPage,i);
    btreeParseCellPtr(pPage, pCell, &info);
    sz = info.nPayload;
    /* For intKey pages, check that the keys are in order.
    */
    if( pPage->intKey ){
      if( i==0 ){
        nMinKey = nMaxKey = info.nKey;
      }else if( info.nKey <= nMaxKey ){
        checkAppendMsg(pCheck,
           "Rowid %lld out of order (previous was %lld)", info.nKey, nMaxKey);
      }
      nMaxKey = info.nKey;
    }
    if( (sz>info.nLocal) 
     && (&pCell[info.iOverflow]<=&pPage->aData[pBt->usableSize])
    ){
      int nPage = (sz - info.nLocal + usableSize - 5)/(usableSize - 4);
      Pgno pgnoOvfl = get4byte(&pCell[info.iOverflow]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage);
    }

    /* Check sanity of left child page.
    */
    if( !pPage->leaf ){
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, &nMinKey, i==0?NULL:&nMaxKey);
      if( i>0 && d2!=depth ){
        checkAppendMsg(pCheck, "Child page depth differs");
      }
      depth = d2;
    }
  }

  if( !pPage->leaf ){
    pgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    pCheck->zPfx = "On page %d at right child: ";
    pCheck->v1 = iPage;
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
    }
#endif
    checkTreePage(pCheck, pgno, NULL, !pPage->nCell?NULL:&nMaxKey);
  }
 
  /* For intKey leaf pages, check that the min/max keys are in order
  ** with any left/parent/right pages.
  */
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  if( pPage->leaf && pPage->intKey ){
    /* if we are a left child page */
    if( pnParentMinKey ){
      /* if we are the left most child page */
      if( !pnParentMaxKey ){
        if( nMaxKey > *pnParentMinKey ){
          checkAppendMsg(pCheck,
              "Rowid %lld out of order (max larger than parent min of %lld)",
              nMaxKey, *pnParentMinKey);
        }
      }else{
        if( nMinKey <= *pnParentMinKey ){
          checkAppendMsg(pCheck,
              "Rowid %lld out of order (min less than parent min of %lld)",
              nMinKey, *pnParentMinKey);
        }
        if( nMaxKey > *pnParentMaxKey ){
          checkAppendMsg(pCheck,
              "Rowid %lld out of order (max larger than parent max of %lld)",
              nMaxKey, *pnParentMaxKey);
        }
        *pnParentMinKey = nMaxKey;
      }
    /* else if we're a right child page */
    } else if( pnParentMaxKey ){
      if( nMinKey <= *pnParentMaxKey ){
        checkAppendMsg(pCheck,
            "Rowid %lld out of order (min less than parent max of %lld)",
            nMinKey, *pnParentMaxKey);
      }
    }
  }

  /* Check for complete coverage of the page
  */
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  hit = sqlite3PageMalloc( pBt->pageSize );
  pCheck->zPfx = 0;
  if( hit==0 ){
    pCheck->mallocFailed = 1;
  }else{
    int contentOffset = get2byteNotZero(&data[hdr+5]);
    assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */
    memset(hit+contentOffset, 0, usableSize-contentOffset);
    memset(hit, 1, contentOffset);
    /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
    ** number of cells on the page. */
    nCell = get2byte(&data[hdr+3]);
    /* EVIDENCE-OF: R-23882-45353 The cell pointer array of a b-tree page
    ** immediately follows the b-tree page header. */
    cellStart = hdr + 12 - 4*pPage->leaf;
    /* EVIDENCE-OF: R-02776-14802 The cell pointer array consists of K 2-byte
    ** integer offsets to the cell contents. */
    for(i=0; i<nCell; i++){
      int pc = get2byte(&data[cellStart+i*2]);
      u32 size = 65536;
      int j;
      if( pc<=usableSize-4 ){
        size = cellSizePtr(pPage, &data[pc]);
      }
      if( (int)(pc+size-1)>=usableSize ){
        pCheck->zPfx = 0;
        checkAppendMsg(pCheck,
            "Corruption detected in cell %d on page %d",i,iPage);
      }else{
        for(j=pc+size-1; j>=pc; j--) hit[j]++;
      }
    }
    /* EVIDENCE-OF: R-20690-50594 The second field of the b-tree page header
    ** is the offset of the first freeblock, or zero if there are no
    ** freeblocks on the page. */
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( i<=usableSize-4 );     /* Enforced by btreeInitPage() */
      size = get2byte(&data[i+2]);
      assert( i+size<=usableSize );  /* Enforced by btreeInitPage() */
      for(j=i+size-1; j>=i; j--) hit[j]++;
      /* EVIDENCE-OF: R-58208-19414 The first 2 bytes of a freeblock are a
      ** big-endian integer which is the offset in the b-tree page of the next
      ** freeblock in the chain, or zero if the freeblock is the last on the
      ** chain. */
      j = get2byte(&data[i]);
      /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
      ** increasing offset. */
      assert( j==0 || j>i+size );  /* Enforced by btreeInitPage() */
      assert( j<=usableSize-4 );   /* Enforced by btreeInitPage() */
      i = j;
    }
    for(i=cnt=0; i<usableSize; i++){
      if( hit[i]==0 ){
        cnt++;
      }else if( hit[i]>1 ){
        checkAppendMsg(pCheck,
          "Multiple uses for byte %d of page %d", i, iPage);
        break;
      }
    }
    /* EVIDENCE-OF: R-43263-13491 The total number of bytes in all fragments
    ** is stored in the fifth field of the b-tree page header.
    ** EVIDENCE-OF: R-07161-27322 The one-byte integer at offset 7 gives the
    ** number of fragmented free bytes within the cell content area.
    */
    if( cnt!=data[hdr+7] ){
      checkAppendMsg(pCheck,
          "Fragmentation of %d bytes reported as %d on page %d",
          cnt, data[hdr+7], iPage);
    }
  }
  sqlite3PageFree(hit);
  releasePage(pPage);

end_of_check:
  pCheck->zPfx = saved_zPfx;
  pCheck->v1 = saved_v1;
  pCheck->v2 = saved_v2;
  return depth+1;
}